

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermSubstitutionTree.hpp
# Opt level: O2

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
 __thiscall
Indexing::TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::getInstances
          (TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *this,TypedTermList t,
          bool retrieveSubstitutions)

{
  getResultIterator<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::FastInstancesIterator>
            ((TermSubstitutionTree<Inferences::ALASCA::Demodulation::Lhs> *)&stack0xffffffffffffffe8
             ,t,retrieveSubstitutions);
  Lib::
  pvi<Lib::IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Inferences::ALASCA::Demodulation::Lhs>>>>
            ((Lib *)this,
             (IterTraits<Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>_>
              *)&stack0xffffffffffffffe8);
  Lib::
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
  ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
                      *)&stack0xffffffffffffffe8);
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::Demodulation::Lhs>_>
            *)this;
}

Assistant:

VirtualIterator<Indexing::QueryRes<ResultSubstitutionSP, LeafData_>> getInstances(TypedTermList t, bool retrieveSubstitutions) final override
  { return pvi(getResultIterator<FastInstancesIterator>(t, retrieveSubstitutions)); }